

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderHeatmap<short,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,short *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImPlotScale IVar1;
  double dVar2;
  double v;
  double local_210;
  ImVec2 local_1fc;
  ImVec2 local_1f4;
  ImU32 local_1ec;
  undefined1 auStack_1e8 [4];
  ImU32 col_1;
  ImVec4 color;
  double t;
  ImVec2 size;
  char buff [32];
  ImVec2 local_1a0;
  ImVec2 px;
  ImPlotPoint p;
  int local_180;
  int c;
  int r;
  int i;
  ImPlotPoint half_size;
  double h;
  double w;
  RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLog> local_150;
  TransformerLinLog local_134;
  RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLog> local_130;
  TransformerLogLin local_114;
  RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLin> local_110;
  TransformerLinLin local_f4;
  RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin> local_f0;
  undefined1 local_d8 [8];
  GetterHeatmap<short> getter;
  double ydir;
  double yref;
  ImU32 col;
  ImVec2 b;
  ImVec2 a;
  short temp_max;
  short temp_min;
  ImPlotContext *gp;
  bool reverse_y_local;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  short *values_local;
  ImDrawList *DrawList_local;
  TransformerLinLog transformer_local;
  
  stack0xffffffffffffffb0 = GImPlot;
  fmt_local = (char *)scale_max;
  scale_max_local = scale_min;
  DrawList_local._4_4_ = transformer.YAxis;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    ImMinMaxArray<short>(values,rows * cols,(short *)((long)&a.x + 2),(short *)&a);
    scale_max_local = (double)(int)a.x._2_2_;
    fmt_local = (char *)(double)(int)a.x._0_2_;
  }
  if ((scale_max_local != (double)fmt_local) || (NAN(scale_max_local) || NAN((double)fmt_local))) {
    if (reverse_y) {
      local_210 = bounds_max->y;
    }
    else {
      local_210 = bounds_min->y;
    }
    getter.HalfSize.y = (double)(int)(-(reverse_y & 1) | 1);
    GetterHeatmap<short>::GetterHeatmap
              ((GetterHeatmap<short> *)local_d8,values,rows,cols,scale_max_local,(double)fmt_local,
               (bounds_max->x - bounds_min->x) / (double)cols,
               (bounds_max->y - bounds_min->y) / (double)rows,bounds_min->x,local_210,
               getter.HalfSize.y);
    IVar1 = GetCurrentScale();
    switch(IVar1) {
    case 0:
      TransformerLinLin::TransformerLinLin(&local_f4);
      RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin>::RectRenderer
                (&local_f0,(GetterHeatmap<short> *)local_d8,&local_f4);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLinLin>>
                (&local_f0,DrawList,&stack0xffffffffffffffb0->CurrentPlot->PlotRect);
      break;
    case 1:
      TransformerLogLin::TransformerLogLin(&local_114);
      RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLin>::RectRenderer
                (&local_110,(GetterHeatmap<short> *)local_d8,&local_114);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLogLin>>
                (&local_110,DrawList,&stack0xffffffffffffffb0->CurrentPlot->PlotRect);
      break;
    case 2:
      TransformerLinLog::TransformerLinLog(&local_134);
      RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLog>::RectRenderer
                (&local_130,(GetterHeatmap<short> *)local_d8,&local_134);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLinLog>>
                (&local_130,DrawList,&stack0xffffffffffffffb0->CurrentPlot->PlotRect);
      break;
    case 3:
      TransformerLogLog::TransformerLogLog((TransformerLogLog *)((long)&w + 4));
      RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLog>::RectRenderer
                (&local_150,(GetterHeatmap<short> *)local_d8,(TransformerLogLog *)((long)&w + 4));
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLogLog>>
                (&local_150,DrawList,&stack0xffffffffffffffb0->CurrentPlot->PlotRect);
    }
    if (fmt != (char *)0x0) {
      dVar2 = (bounds_max->x - bounds_min->x) / (double)cols;
      half_size.y = (bounds_max->y - bounds_min->y) / (double)rows;
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&r,dVar2 * 0.5,half_size.y * 0.5);
      c = 0;
      for (local_180 = 0; local_180 < rows; local_180 = local_180 + 1) {
        for (p.y._4_4_ = 0; p.y._4_4_ < cols; p.y._4_4_ = p.y._4_4_ + 1) {
          ImPlotPoint::ImPlotPoint((ImPlotPoint *)&px);
          px = (ImVec2)((double)p.y._4_4_ * dVar2 + dVar2 * 0.5 + bounds_min->x);
          local_1a0 = TransformerLinLog::operator()
                                ((TransformerLinLog *)((long)&DrawList_local + 4),(ImPlotPoint *)&px
                                );
          sprintf((char *)&size,fmt,(ulong)(uint)(int)values[c]);
          t = (double)ImGui::CalcTextSize((char *)&size,(char *)0x0,false,-1.0);
          v = ImRemap01<double>((double)(int)values[c],scale_max_local,(double)fmt_local);
          color._8_8_ = ImClamp<double>(v,0.0,1.0);
          _auStack_1e8 = SampleColormap((float)(double)color._8_8_,-1);
          local_1ec = CalcTextColor((ImVec4 *)auStack_1e8);
          local_1fc = ::operator*((ImVec2 *)&t,0.5);
          local_1f4 = operator-(&local_1a0,&local_1fc);
          ImDrawList::AddText(DrawList,&local_1f4,local_1ec,(char *)&size,(char *)0x0);
          c = c + 1;
        }
      }
    }
  }
  else {
    b = TransformerLinLog::operator()((TransformerLinLog *)((long)&DrawList_local + 4),bounds_min);
    register0x00001200 =
         TransformerLinLog::operator()((TransformerLinLog *)((long)&DrawList_local + 4),bounds_max);
    yref._0_4_ = GetColormapColorU32(0,(stack0xffffffffffffffb0->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,&b,(ImVec2 *)((long)&yref + 4),yref._0_4_,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}